

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

long intval(vm_val_t *val,long minval,long maxval,int pct,unsigned_long mask)

{
  vm_datatype_t vVar1;
  int iVar2;
  uint32_t uVar3;
  int32_t iVar4;
  ulong uVar5;
  int ov;
  int local_2c;
  
  vVar1 = val->typ;
  if (vVar1 == VM_NIL) {
    uVar5 = 0;
  }
  else if (vVar1 == VM_OBJ) {
    iVar2 = CVmObjBigNum::is_bignum_obj((val->val).obj);
    if (iVar2 == 0) goto LAB_002697b1;
    if (minval < 0) {
      iVar4 = CVmObjBigNum::convert_to_int
                        ((CVmObjBigNum *)
                         (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff)),
                         &local_2c);
      uVar5 = (ulong)iVar4;
    }
    else {
      uVar3 = CVmObjBigNum::convert_to_uint
                        ((CVmObjBigNum *)
                         (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff)),
                         &local_2c);
      uVar5 = (ulong)uVar3;
    }
    if ((pct == 0) && (local_2c != 0)) goto LAB_002697f3;
  }
  else if (vVar1 == VM_INT) {
    uVar5 = (ulong)(val->val).intval;
  }
  else {
LAB_002697b1:
    iVar4 = vm_val_t::cast_to_int(val);
    uVar5 = (ulong)iVar4;
  }
  if (pct == 0) {
    if (((long)uVar5 < minval) || (maxval < (long)uVar5)) {
LAB_002697f3:
      err_throw(0x7e7);
    }
  }
  else {
    uVar5 = uVar5 & mask;
  }
  return uVar5;
}

Assistant:

static long intval(VMG_ const vm_val_t *val, long minval, long maxval,
                   int pct, unsigned long mask)
{
    /* get the value */
    long l;
    switch (val->typ)
    {
    case VM_NIL:
        /* use 0 for nil */
        l = 0;
        break;

    case VM_INT:
        /* regular integer */
        l = val->val.intval;
        break;

    case VM_OBJ:
        /* 
         *   convert BigNumber to integer explicitly; use the type cast for
         *   other types 
         */
        if (CVmObjBigNum::is_bignum_obj(vmg_ val->val.obj))
        {
            /* explicitly cast the BigNumber so that we can catch overflows */
            int ov;
            if (minval < 0)
            {
                l = ((CVmObjBigNum *)vm_objp(vmg_ val->val.obj))
                    ->convert_to_int(ov);
            }
            else
            {
                l = (long)((CVmObjBigNum *)vm_objp(vmg_ val->val.obj))
                    ->convert_to_uint(ov);
            }

            /* check for overflow */
            if (ov && !pct)
                err_throw(VMERR_NUM_OVERFLOW);;

            /* done */
            break;
        }
        /* FALL THROUGH to default */

    default:
        /* use the generic type cast */
        l = val->cast_to_int(vmg0_);
        break;
    }